

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::FindPrevUserEntry(DBIter *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  long in_RDI;
  long in_FS_OFFSET;
  ValueType value_type;
  Slice raw_value;
  ParsedInternalKey ikey;
  string empty;
  DBIter *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  DBIter *in_stack_ffffffffffffff48;
  int local_94;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ulong local_38;
  int local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x90) != 1) {
    __assert_fail("direction_ == kReverse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0xed,"void leveldb::(anonymous namespace)::DBIter::FindPrevUserEntry()");
  }
  local_94 = 0;
  uVar3 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))();
  while ((uVar3 & 1) != 0) {
    ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)in_stack_ffffffffffffff28);
    bVar1 = ParseKey(in_stack_ffffffffffffff48,(ParsedInternalKey *)in_stack_ffffffffffffff40);
    if ((bVar1) && (local_38 <= *(ulong *)(in_RDI + 0x40))) {
      bVar1 = false;
      if (local_94 != 0) {
        in_stack_ffffffffffffff48 = *(DBIter **)(in_RDI + 0x30);
        Slice::Slice((Slice *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        iVar2 = (*(in_stack_ffffffffffffff48->super_Iterator)._vptr_Iterator[2])
                          (in_stack_ffffffffffffff48,local_48,local_58);
        bVar1 = iVar2 < 0;
      }
      if (bVar1) break;
      local_94 = local_30;
      if (local_30 == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff28);
        ClearSavedValue(in_stack_ffffffffffffff28);
      }
      else {
        (**(code **)(**(long **)(in_RDI + 0x38) + 0x48))();
        in_stack_ffffffffffffff40 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             capacity((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffff48);
        sVar4 = Slice::size((Slice *)in_stack_ffffffffffffff28);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar4 + 0x100000)
            < in_stack_ffffffffffffff40) {
          std::__cxx11::string::string(in_stack_ffffffffffffff40);
          std::swap<char,std::char_traits<char>,std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18a2f58)
          ;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff28);
        }
        (**(code **)(**(long **)(in_RDI + 0x38) + 0x40))();
        ExtractUserKey((Slice *)in_stack_ffffffffffffff38);
        SaveKey(in_stack_ffffffffffffff48,(Slice *)in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff38);
        in_stack_ffffffffffffff30 = (string *)(in_RDI + 0x70);
        in_stack_ffffffffffffff38 = (string *)Slice::data((Slice *)in_stack_ffffffffffffff28);
        Slice::size((Slice *)in_stack_ffffffffffffff28);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                   (size_type)in_stack_ffffffffffffff38);
      }
    }
    (**(code **)(**(long **)(in_RDI + 0x38) + 0x38))();
    uVar3 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))();
  }
  if (local_94 == 0) {
    *(undefined1 *)(in_RDI + 0x94) = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff28);
    ClearSavedValue(in_stack_ffffffffffffff28);
    *(undefined4 *)(in_RDI + 0x90) = 0;
  }
  else {
    *(undefined1 *)(in_RDI + 0x94) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::FindPrevUserEntry() {
  assert(direction_ == kReverse);

  ValueType value_type = kTypeDeletion;
  if (iter_->Valid()) {
    do {
      ParsedInternalKey ikey;
      if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
        if ((value_type != kTypeDeletion) &&
            user_comparator_->Compare(ikey.user_key, saved_key_) < 0) {
          // We encountered a non-deleted value in entries for previous keys,
          break;
        }
        value_type = ikey.type;
        if (value_type == kTypeDeletion) {
          saved_key_.clear();
          ClearSavedValue();
        } else {
          Slice raw_value = iter_->value();
          if (saved_value_.capacity() > raw_value.size() + 1048576) {
            std::string empty;
            swap(empty, saved_value_);
          }
          SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
          saved_value_.assign(raw_value.data(), raw_value.size());
        }
      }
      iter_->Prev();
    } while (iter_->Valid());
  }

  if (value_type == kTypeDeletion) {
    // End
    valid_ = false;
    saved_key_.clear();
    ClearSavedValue();
    direction_ = kForward;
  } else {
    valid_ = true;
  }
}